

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::HandleResponseFile
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,const_iterator argBeg,const_iterator argEnd)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string error;
  ifstream responseFile;
  undefined1 local_278 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  long local_238 [4];
  byte abStack_218 [488];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argBeg._M_current != argEnd._M_current) {
    do {
      if (*((argBeg._M_current)->_M_dataplus)._M_p == '@') {
        std::__cxx11::string::substr((ulong)&local_258,(ulong)argBeg._M_current);
        std::ifstream::ifstream((istream *)local_238,(char *)local_258._M_allocated_capacity,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_allocated_capacity != &local_248) {
          operator_delete((void *)local_258._M_allocated_capacity,
                          CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0])
                          + 1);
        }
        local_258._M_allocated_capacity = (size_type)&local_248;
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
          local_258._8_8_ = 0;
          local_248._M_local_buf[0] = '\0';
          cmsys::SystemTools::GetLineFromStream
                    ((istream *)local_238,(string *)&local_258,(bool *)0x0,-1);
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = (pointer)0x0;
          local_278._16_8_ = (pointer)0x0;
          ParseUnixCommandLine
                    ((char *)local_258._M_allocated_capacity,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_278);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,local_278._0_8_,local_278._8_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_278);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"failed to open for reading (","");
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          std::__cxx11::string::_M_append(local_258._M_local_buf,local_278._0_8_);
          if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_278._16_8_)->_M_p + 1));
          }
          std::__cxx11::string::append(local_258._M_local_buf);
          std::__cxx11::string::substr((ulong)local_278,(ulong)argBeg._M_current);
          std::__cxx11::string::_M_append(local_258._M_local_buf,local_278._0_8_);
          if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_278._16_8_)->_M_p + 1));
          }
          Error((char *)local_258._M_allocated_capacity,(char *)0x0,(char *)0x0,(char *)0x0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_allocated_capacity != &local_248) {
          operator_delete((void *)local_258._M_allocated_capacity,
                          CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0])
                          + 1);
        }
        std::ifstream::~ifstream((istream *)local_238);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,argBeg._M_current);
      }
      argBeg._M_current = argBeg._M_current + 1;
    } while (argBeg._M_current != argEnd._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::HandleResponseFile(
  std::vector<std::string>::const_iterator argBeg,
  std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full;
  for (std::vector<std::string>::const_iterator a = argBeg; a != argEnd; ++a) {
    std::string const& arg = *a;
    if (cmHasLiteralPrefix(arg, "@")) {
      cmsys::ifstream responseFile(arg.substr(1).c_str(), std::ios::in);
      if (!responseFile) {
        std::string error = "failed to open for reading (";
        error += cmSystemTools::GetLastSystemError();
        error += "):\n  ";
        error += arg.substr(1);
        cmSystemTools::Error(error.c_str());
      } else {
        std::string line;
        cmSystemTools::GetLineFromStream(responseFile, line);
        std::vector<std::string> args2;
#ifdef _WIN32
        cmSystemTools::ParseWindowsCommandLine(line.c_str(), args2);
#else
        cmSystemTools::ParseUnixCommandLine(line.c_str(), args2);
#endif
        arg_full.insert(arg_full.end(), args2.begin(), args2.end());
      }
    } else {
      arg_full.push_back(arg);
    }
  }
  return arg_full;
}